

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_tree.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
expression_tree::parallel::
evaluate<std::__cxx11::string,expression_tree::cache_on_assignment,expression_tree::parallel>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,parallel *this,operation<std::__cxx11::basic_string<char>_> *o,
          node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_expression_tree::cache_on_assignment,_expression_tree::parallel>
          *l,node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_expression_tree::cache_on_assignment,_expression_tree::parallel>
             *r)

{
  node_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pnVar1;
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> fVar2;
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> t;
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> fStack_68
  ;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_38._M_dataplus._M_p =
       (pointer)node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_expression_tree::cache_on_assignment,_expression_tree::parallel>
                ::evaluate;
  local_38._M_string_length = 0;
  local_58._M_dataplus._M_p = (pointer)o;
  fVar2 = std::
          async<std::__cxx11::string(expression_tree::node<std::__cxx11::string,expression_tree::cache_on_assignment,expression_tree::parallel>::*)()const,expression_tree::node<std::__cxx11::string,expression_tree::cache_on_assignment,expression_tree::parallel>const*>
                    ((type *)&fStack_68,
                     (node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_expression_tree::cache_on_assignment,_expression_tree::parallel>
                      **)&local_38);
  pnVar1 = (l->impl)._M_t.
           super___uniq_ptr_impl<expression_tree::detail::node_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<expression_tree::detail::node_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_expression_tree::detail::node_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<expression_tree::detail::node_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .
           super__Head_base<0UL,_expression_tree::detail::node_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
           ._M_head_impl;
  (*pnVar1->_vptr_node_impl[4])
            (&local_38,pnVar1,
             fVar2.
             super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
            (&local_58,&fStack_68);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator()(__return_storage_ptr__,
               (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)this,&local_58,&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&fStack_68.
              super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

static T evaluate(const detail::operation<T>& o, const node<T, C, E>& l, const node<T, C, E>& r)
	{
		std::future<T> f = std::async(&node<T, C, E>::evaluate, &l);

		// Let's not rely on any assumption of parameter evaluation order...
		T t = r.evaluate();

		return o(f.get(), t);
	}